

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall tinyusdz::GPrim::set_primvar(GPrim *this,GeomPrimvar *primvar,string *err)

{
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this_00;
  pointer pcVar1;
  pointer pcVar2;
  pointer pcVar3;
  pointer pSVar4;
  undefined8 uVar5;
  int iVar6;
  mapped_type *pmVar7;
  Sample *sample;
  pointer pSVar8;
  bool bVar9;
  PrimVar var;
  string primvar_name;
  string index_name;
  Attribute indices;
  storage_union local_bf8;
  undefined1 *local_be8;
  undefined1 local_be0;
  undefined1 local_bd8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bb8;
  key_type local_b98;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_b78;
  undefined1 local_b60 [40];
  _Alloc_hider local_b38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b28;
  storage_union local_b18;
  vtable_type *local_b08;
  bool local_b00;
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  local_af8;
  bool local_ae0;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_ad8;
  AttrMetas local_ac0;
  undefined1 local_8b8 [32];
  Variability local_898;
  bool local_894;
  _Alloc_hider local_890;
  size_type local_888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_880;
  storage_union local_870;
  vtable_type *local_860;
  bool local_858;
  undefined1 local_850 [32];
  undefined1 local_830 [24];
  AttrMetas AStack_818;
  undefined1 local_610 [72];
  any local_5c8;
  bool local_5b0;
  pointer local_5a8;
  pointer local_5a0;
  pointer local_598;
  bool local_590;
  pointer local_588;
  pointer local_580;
  pointer local_578;
  AttrMetas AStack_570;
  ListEditQual local_368;
  Type TStack_364;
  Type local_360;
  Path PStack_358;
  pointer local_288;
  pointer local_280;
  pointer local_278;
  ListEditQual local_270;
  AttrMetas AStack_268;
  bool local_60;
  string asStack_58 [32];
  bool local_38;
  
  pcVar3 = local_610 + 0x10;
  pcVar1 = (primvar->_name)._M_dataplus._M_p;
  local_610._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_610,pcVar1,pcVar1 + (primvar->_name)._M_string_length);
  uVar5 = local_610._8_8_;
  if ((pointer)local_610._0_8_ != pcVar3) {
    operator_delete((void *)local_610._0_8_,local_610._16_8_ + 1);
  }
  if (uVar5 == 0) {
    if (err != (string *)0x0) {
      std::__cxx11::string::append((char *)err);
    }
    return false;
  }
  pcVar1 = (primvar->_name)._M_dataplus._M_p;
  local_610._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_610,pcVar1,pcVar1 + (primvar->_name)._M_string_length);
  pcVar1 = local_b60 + 0x10;
  local_b60._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b60,"primvars:","");
  if ((ulong)local_610._8_8_ < (ulong)local_b60._8_8_) {
    bVar9 = false;
  }
  else if (local_b60._8_8_ == 0) {
    bVar9 = true;
  }
  else {
    iVar6 = bcmp((void *)local_b60._0_8_,(void *)local_610._0_8_,local_b60._8_8_);
    bVar9 = iVar6 == 0;
  }
  if ((pointer)local_b60._0_8_ != pcVar1) {
    operator_delete((void *)local_b60._0_8_,local_b60._16_8_ + 1);
  }
  if ((pointer)local_610._0_8_ != pcVar3) {
    operator_delete((void *)local_610._0_8_,local_610._16_8_ + 1);
  }
  if (bVar9) {
    if (err == (string *)0x0) {
      return false;
    }
    pcVar2 = (primvar->_name)._M_dataplus._M_p;
    local_b60._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b60,pcVar2,pcVar2 + (primvar->_name)._M_string_length);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610,
                   "GeomPrimvar.name must not start with `primvars:` namespace. name = ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b60);
    std::__cxx11::string::_M_append((char *)err,local_610._0_8_);
    if ((pointer)local_610._0_8_ != pcVar3) {
      operator_delete((void *)local_610._0_8_,local_610._16_8_ + 1);
    }
    if ((pointer)local_b60._0_8_ == pcVar1) {
      return false;
    }
    operator_delete((void *)local_b60._0_8_,local_b60._16_8_ + 1);
    return false;
  }
  pcVar2 = (primvar->_name)._M_dataplus._M_p;
  local_610._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_610,pcVar2,pcVar2 + (primvar->_name)._M_string_length);
  std::operator+(&local_bb8,"primvars:",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_610);
  if ((pointer)local_610._0_8_ != pcVar3) {
    operator_delete((void *)local_610._0_8_,local_610._16_8_ + 1);
  }
  pcVar3 = (primvar->_attr)._name._M_dataplus._M_p;
  local_b60._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_b60,pcVar3,pcVar3 + (primvar->_attr)._name._M_string_length);
  local_b60[0x24] = (primvar->_attr)._varying_authored;
  local_b60._32_4_ = (primvar->_attr)._variability;
  local_b38._M_p = (pointer)&local_b28;
  pcVar3 = (primvar->_attr)._type_name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b38,pcVar3,pcVar3 + (primvar->_attr)._type_name._M_string_length);
  local_b08 = (primvar->_attr)._var._value.v_.vtable;
  if (local_b08 != (vtable_type *)0x0) {
    (*local_b08->copy)((storage_union *)&(primvar->_attr)._var,&local_b18);
  }
  local_b00 = (primvar->_attr)._var._blocked;
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::vector(&local_af8,&(primvar->_attr)._var._ts._samples);
  local_ae0 = (primvar->_attr)._var._ts._dirty;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&local_ad8,&(primvar->_attr)._paths);
  AttrMetas::AttrMetas(&local_ac0,&(primvar->_attr)._metas);
  if (((primvar->_interpolation).has_value_ == true) &&
     (local_ac0.interpolation.contained = (primvar->_interpolation).contained,
     local_ac0.interpolation.has_value_ == false)) {
    local_ac0.interpolation.has_value_ = true;
  }
  if (((primvar->_elementSize).has_value_ == true) &&
     (local_ac0.elementSize.contained = (primvar->_elementSize).contained,
     local_ac0.elementSize.has_value_ == false)) {
    local_ac0.elementSize.has_value_ = true;
  }
  Property::Property((Property *)local_610,(Attribute *)local_b60,false);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::operator[](&this->props,&local_bb8);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)local_610);
  (pmVar7->_attrib)._variability = local_610._32_4_;
  (pmVar7->_attrib)._varying_authored = local_610[0x24];
  std::__cxx11::string::operator=
            ((string *)&(pmVar7->_attrib)._type_name,(string *)(local_610 + 0x28));
  linb::any::operator=((any *)&(pmVar7->_attrib)._var,&local_5c8);
  (pmVar7->_attrib)._var._blocked = local_5b0;
  local_8b8._0_8_ =
       (pmVar7->_attrib)._var._ts._samples.
       super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_8b8._8_8_ =
       *(pointer *)
        ((long)&(pmVar7->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data + 8);
  local_8b8._16_8_ =
       *(pointer *)
        ((long)&(pmVar7->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data + 0x10);
  (pmVar7->_attrib)._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = local_5a8;
  *(pointer *)
   ((long)&(pmVar7->_attrib)._var._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data + 8) = local_5a0;
  *(pointer *)
   ((long)&(pmVar7->_attrib)._var._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data + 0x10) = local_598;
  local_5a8 = (pointer)0x0;
  local_5a0 = (pointer)0x0;
  local_598 = (pointer)0x0;
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_8b8);
  (pmVar7->_attrib)._var._ts._dirty = local_590;
  local_8b8._0_8_ =
       (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_8b8._8_8_ =
       (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_8b8._16_8_ =
       (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = local_588;
  (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_580;
  (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_578;
  local_588 = (pointer)0x0;
  local_580 = (pointer)0x0;
  local_578 = (pointer)0x0;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_8b8);
  AttrMetas::operator=(&(pmVar7->_attrib)._metas,&AStack_570);
  pmVar7->_listOpQual = local_368;
  pmVar7->_type = TStack_364;
  (pmVar7->_rel).type = local_360;
  Path::operator=(&(pmVar7->_rel).targetPath,&PStack_358);
  local_8b8._0_8_ =
       (pmVar7->_rel).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_8b8._8_8_ =
       (pmVar7->_rel).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_8b8._16_8_ =
       (pmVar7->_rel).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pmVar7->_rel).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = local_288;
  (pmVar7->_rel).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = local_280;
  (pmVar7->_rel).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_278;
  local_288 = (pointer)0x0;
  local_280 = (pointer)0x0;
  local_278 = (pointer)0x0;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_8b8);
  (pmVar7->_rel).listOpQual = local_270;
  AttrMetas::operator=(&(pmVar7->_rel)._metas,&AStack_268);
  (pmVar7->_rel)._varying_authored = local_60;
  std::__cxx11::string::operator=((string *)&pmVar7->_prop_value_type_name,asStack_58);
  pmVar7->_has_custom = local_38;
  Property::~Property((Property *)local_610);
  local_be8 = linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_bf8.dynamic = (void *)0x0;
  local_be0 = 0;
  local_bd8._0_8_ = (pointer)0x0;
  local_bd8[8] = 0;
  local_bd8._9_7_ = 0;
  local_bd8[0x10] = 0;
  local_bd8._17_8_ = 0;
  if ((primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    linb::any::operator=((any *)&local_bf8,&primvar->_indices);
  }
  this_00 = &primvar->_ts_indices;
  if ((primvar->_ts_indices)._dirty == true) {
    TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::update(this_00);
  }
  if ((primvar->_ts_indices)._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (primvar->_ts_indices)._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    if ((primvar->_ts_indices)._dirty == true) {
      TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::update(this_00);
    }
    pSVar8 = (primvar->_ts_indices)._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar4 = (primvar->_ts_indices)._samples.
             super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar8 != pSVar4) {
      do {
        tinyusdz::primvar::PrimVar::set_timesample<std::vector<int,std::allocator<int>>>
                  ((PrimVar *)&local_bf8,pSVar8->t,&pSVar8->value);
        pSVar8 = pSVar8 + 1;
      } while (pSVar8 != pSVar4);
    }
  }
  if ((primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (primvar->_indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    if ((primvar->_ts_indices)._dirty == true) {
      TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::update(this_00);
    }
    if ((primvar->_ts_indices)._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (primvar->_ts_indices)._samples.
        super__Vector_base<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) goto LAB_0018837d;
  }
  local_8b8._0_8_ = local_8b8 + 0x10;
  local_8b8._8_8_ = (pointer)0x0;
  local_8b8._16_8_ = local_8b8._16_8_ & 0xffffffffffffff00;
  local_898 = Varying;
  local_894 = false;
  local_890._M_p = (pointer)&local_880;
  local_888 = 0;
  local_880._M_local_buf[0] = '\0';
  local_860 = (vtable_type *)linb::any::vtable_for_type<decltype(nullptr)>()::table;
  local_870.dynamic = (void *)0x0;
  local_858 = false;
  local_850._0_8_ = (pointer)0x0;
  local_850[8] = 0;
  local_850._9_7_ = 0;
  local_850[0x10] = 0;
  local_850._17_8_ = 0;
  AStack_818.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  AStack_818.elementSize.has_value_ = false;
  AStack_818.elementSize.contained = (storage_t<unsigned_int>)0x0;
  AStack_818.hidden.has_value_ = false;
  AStack_818.hidden.contained = (storage_t<bool>)0x0;
  AStack_818.comment.has_value_ = false;
  AStack_818.weight.contained = (storage_t<double>)0x0;
  AStack_818.connectability.has_value_ = false;
  AStack_818.bindMaterialAs.contained._16_8_ = 0;
  AStack_818.bindMaterialAs.contained._24_8_ = 0;
  AStack_818.bindMaterialAs.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.bindMaterialAs.contained._8_8_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  AStack_818.comment.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.comment.contained._8_8_ = 0;
  AStack_818.comment.contained._16_8_ = 0;
  AStack_818.comment.contained._24_8_ = 0;
  AStack_818.comment.contained._32_8_ = 0;
  AStack_818.comment.contained._40_8_ = 0;
  AStack_818.customData.has_value_ = false;
  AStack_818.customData.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.customData.contained._8_8_ = 0;
  AStack_818.customData.contained._16_8_ = 0;
  AStack_818.customData.contained._24_8_ = 0;
  AStack_818.customData.contained._32_8_ = 0;
  AStack_818.customData.contained._40_8_ = 0;
  AStack_818.weight.has_value_ = false;
  AStack_818.connectability.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.connectability.contained._8_8_ = 0;
  AStack_818.connectability.contained._16_8_ = 0;
  AStack_818.connectability.contained._24_8_ = 0;
  AStack_818.outputName.has_value_ = false;
  AStack_818.outputName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.outputName.contained._8_8_ = 0;
  AStack_818.outputName.contained._16_8_ = 0;
  AStack_818.outputName.contained._24_8_ = 0;
  AStack_818.renderType.has_value_ = false;
  AStack_818.sdrMetadata.has_value_ = false;
  AStack_818.renderType.contained._16_8_ = 0;
  AStack_818.renderType.contained._24_8_ = 0;
  AStack_818.renderType.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.renderType.contained._8_8_ = 0;
  AStack_818.displayName.has_value_ = false;
  AStack_818.sdrMetadata.contained._32_8_ = 0;
  AStack_818.sdrMetadata.contained._40_8_ = 0;
  AStack_818.sdrMetadata.contained._16_8_ = 0;
  AStack_818.sdrMetadata.contained._24_8_ = 0;
  AStack_818.sdrMetadata.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.sdrMetadata.contained._8_8_ = 0;
  AStack_818.displayGroup.has_value_ = false;
  AStack_818.displayName.contained._16_8_ = 0;
  AStack_818.displayName.contained._24_8_ = 0;
  AStack_818.displayName.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayName.contained._8_8_ = 0;
  AStack_818.bindMaterialAs.has_value_ = false;
  AStack_818.displayGroup.contained._16_8_ = 0;
  AStack_818.displayGroup.contained._24_8_ = 0;
  AStack_818.displayGroup.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
  AStack_818.displayGroup.contained._8_8_ = 0;
  local_830[0x10] = 0;
  stack0xfffffffffffff7e1 = 0;
  local_830._0_8_ = (pointer)0x0;
  local_830[8] = 0;
  local_830._9_7_ = 0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  AStack_818.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       AStack_818.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_bf8);
  local_b98._M_dataplus._M_p = (pointer)&local_b98.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b98,local_bb8._M_dataplus._M_p,
             local_bb8._M_dataplus._M_p + local_bb8._M_string_length);
  std::__cxx11::string::append((char *)&local_b98);
  Property::Property((Property *)local_610,(Attribute *)local_8b8,false);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
           ::operator[](&this->props,&local_b98);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)local_610);
  (pmVar7->_attrib)._variability = local_610._32_4_;
  (pmVar7->_attrib)._varying_authored = local_610[0x24];
  std::__cxx11::string::operator=
            ((string *)&(pmVar7->_attrib)._type_name,(string *)(local_610 + 0x28));
  linb::any::operator=((any *)&(pmVar7->_attrib)._var,&local_5c8);
  (pmVar7->_attrib)._var._blocked = local_5b0;
  local_b78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(pmVar7->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_b78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish =
       *(pointer *)
        ((long)&(pmVar7->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data + 8);
  local_b78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       *(pointer *)
        ((long)&(pmVar7->_attrib)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data + 0x10);
  (pmVar7->_attrib)._var._ts._samples.
  super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = local_5a8;
  *(pointer *)
   ((long)&(pmVar7->_attrib)._var._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data + 8) = local_5a0;
  *(pointer *)
   ((long)&(pmVar7->_attrib)._var._ts._samples.
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data + 0x10) = local_598;
  local_5a8 = (pointer)0x0;
  local_5a0 = (pointer)0x0;
  local_598 = (pointer)0x0;
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)&local_b78);
  (pmVar7->_attrib)._var._ts._dirty = local_590;
  local_b78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_b78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_b78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_start = local_588;
  (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_finish = local_580;
  (pmVar7->_attrib)._paths.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_578;
  local_588 = (pointer)0x0;
  local_580 = (pointer)0x0;
  local_578 = (pointer)0x0;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_b78);
  AttrMetas::operator=(&(pmVar7->_attrib)._metas,&AStack_570);
  pmVar7->_listOpQual = local_368;
  pmVar7->_type = TStack_364;
  (pmVar7->_rel).type = local_360;
  Path::operator=(&(pmVar7->_rel).targetPath,&PStack_358);
  local_b78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pmVar7->_rel).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_b78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pmVar7->_rel).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b78.super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pmVar7->_rel).targetPathVector.
       super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pmVar7->_rel).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = local_288;
  (pmVar7->_rel).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = local_280;
  (pmVar7->_rel).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_278;
  local_288 = (pointer)0x0;
  local_280 = (pointer)0x0;
  local_278 = (pointer)0x0;
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_b78);
  (pmVar7->_rel).listOpQual = local_270;
  AttrMetas::operator=(&(pmVar7->_rel)._metas,&AStack_268);
  (pmVar7->_rel)._varying_authored = local_60;
  std::__cxx11::string::operator=((string *)&pmVar7->_prop_value_type_name,asStack_58);
  pmVar7->_has_custom = local_38;
  Property::~Property((Property *)local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b98._M_dataplus._M_p != &local_b98.field_2) {
    operator_delete(local_b98._M_dataplus._M_p,local_b98.field_2._M_allocated_capacity + 1);
  }
  AttrMetas::~AttrMetas(&AStack_818);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
            ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)local_830);
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_850);
  if (local_860 != (vtable_type *)0x0) {
    (*local_860->destroy)(&local_870);
    local_860 = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_p != &local_880) {
    operator_delete(local_890._M_p,
                    CONCAT71(local_880._M_allocated_capacity._1_7_,local_880._M_local_buf[0]) + 1);
  }
  if ((pointer)local_8b8._0_8_ != (pointer)(local_8b8 + 0x10)) {
    operator_delete((void *)local_8b8._0_8_,(ulong)(local_8b8._16_8_ + 1));
  }
LAB_0018837d:
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector((vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             *)local_bd8);
  if (local_be8 != (undefined1 *)0x0) {
    (**(code **)(local_be8 + 0x20))(&local_bf8);
    local_be8 = (undefined1 *)0x0;
  }
  AttrMetas::~AttrMetas(&local_ac0);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&local_ad8);
  std::
  vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
  ::~vector(&local_af8);
  if (local_b08 != (vtable_type *)0x0) {
    (*local_b08->destroy)(&local_b18);
    local_b08 = (vtable_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b38._M_p != &local_b28) {
    operator_delete(local_b38._M_p,local_b28._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_b60._0_8_ != local_b60 + 0x10) {
    operator_delete((void *)local_b60._0_8_,local_b60._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bb8._M_dataplus._M_p != &local_bb8.field_2) {
    operator_delete(local_bb8._M_dataplus._M_p,local_bb8.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool GPrim::set_primvar(const GeomPrimvar &primvar,
                        std::string *err) {
  if (primvar.name().empty()) {
    if (err) {
      (*err) += "GeomPrimvar.name is empty.";
    }
    return false;
  }

  if (startsWith(primvar.name(), "primvars:")) {
    if (err) {
      (*err) += "GeomPrimvar.name must not start with `primvars:` namespace. name = " + primvar.name();
    }
    return false;
  }

  std::string primvar_name = kPrimvars + primvar.name();

  // Overwrite existing primvar prop.
  // TODO: Report warn when primvar name already exists.

  Attribute attr = primvar.get_attribute();

  if (primvar.has_interpolation()) {
    attr.metas().interpolation = primvar.get_interpolation();
  }

  if (primvar.has_elementSize()) {
    attr.metas().elementSize = primvar.get_elementSize();
  }

  props[primvar_name] = attr;

  {
    primvar::PrimVar var;

    if (primvar.has_default_indices()) {
      var.set_value(primvar.get_default_indices());
    }

    if (primvar.has_timesampled_indices()) {
      for (const auto &sample : primvar.get_timesampled_indices().get_samples()) {
        var.set_timesample(sample.t, sample.value);
      }
    }

    if (primvar.has_default_indices() || primvar.has_timesampled_indices()) {
      Attribute indices;
      indices.set_var(var);
      std::string index_name = primvar_name + kIndices;
      props[index_name] = indices;
    }

  }

  return true;
}